

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Trace(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  void *local_40;
  uint local_34;
  int fVerbose;
  int fUseLutLib;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  local_34 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"lvh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Speedup(): There is no AIG to map.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar2 = Gia_ManHasMapping(pAbc->pGia);
        if (iVar2 == 0) {
          Abc_Print(-1,"Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          if (bVar1) {
            local_40 = pAbc->pLibLut;
          }
          else {
            local_40 = (void *)0x0;
          }
          pAbc->pGia->pLutLib = local_40;
          Gia_ManDelayTraceLutPrint(pAbc->pGia,local_34);
          pAbc_local._4_4_ = 0;
        }
      }
      return pAbc_local._4_4_;
    }
    if (iVar2 == 0x68) break;
    if (iVar2 == 0x6c) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else {
      if (iVar2 != 0x76) break;
      local_34 = local_34 ^ 1;
    }
  }
  Abc_Print(-2,"usage: &trace [-lvh]\n");
  Abc_Print(-2,"\t           performs delay trace of LUT-mapped network\n");
  pcVar3 = "unit";
  if (bVar1) {
    pcVar3 = "lib";
  }
  Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",pcVar3)
  ;
  pcVar3 = "no";
  if (local_34 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h       : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Trace( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    int fUseLutLib;
    int fVerbose;
    // set defaults
    fUseLutLib = 0;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): There is no AIG to map.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pAbc->pGia->pLutLib = fUseLutLib ? pAbc->pLibLut : NULL;
    Gia_ManDelayTraceLutPrint( pAbc->pGia, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &trace [-lvh]\n" );
    Abc_Print( -2, "\t           performs delay trace of LUT-mapped network\n" );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib": "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}